

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFFileSpecObjectHelper.cc
# Opt level: O3

QPDFFileSpecObjectHelper *
QPDFFileSpecObjectHelper::createFileSpec
          (QPDFFileSpecObjectHelper *__return_storage_ptr__,QPDF *qpdf,string *filename,
          string *fullpath)

{
  _Any_data _Stack_78;
  _Manager_type local_68;
  QPDFEFStreamObjectHelper local_58;
  
  QUtil::file_provider((function<void_(Pipeline_*)> *)&_Stack_78,fullpath);
  QPDFEFStreamObjectHelper::createEFStream(&local_58,qpdf,(function<void_(Pipeline_*)> *)&_Stack_78)
  ;
  createFileSpec(__return_storage_ptr__,qpdf,filename,&local_58);
  QPDFEFStreamObjectHelper::~QPDFEFStreamObjectHelper(&local_58);
  if (local_68 != (code *)0x0) {
    (*local_68)(&_Stack_78,&_Stack_78,__destroy_functor);
  }
  return __return_storage_ptr__;
}

Assistant:

QPDFFileSpecObjectHelper
QPDFFileSpecObjectHelper::createFileSpec(
    QPDF& qpdf, std::string const& filename, std::string const& fullpath)
{
    return createFileSpec(
        qpdf,
        filename,
        QPDFEFStreamObjectHelper::createEFStream(qpdf, QUtil::file_provider(fullpath)));
}